

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O1

bool __thiscall
anon_unknown.dwarf_27de14::PeerManagerImpl::AlreadyHaveTx
          (PeerManagerImpl *this,GenTxid *gtxid,bool include_reconsiderable)

{
  uint256 *puVar1;
  bool bVar2;
  bool bVar3;
  CRollingBloomFilter *pCVar4;
  long in_FS_OFFSET;
  Span<const_unsigned_char> vKey;
  Span<const_unsigned_char> vKey_00;
  Span<const_unsigned_char> vKey_01;
  Wtxid local_58;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  puVar1 = &gtxid->m_hash;
  local_58.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ =
       *(undefined8 *)(puVar1->super_base_blob<256U>).m_data._M_elems;
  local_58.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ =
       *(undefined8 *)((gtxid->m_hash).super_base_blob<256U>.m_data._M_elems + 8);
  local_58.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_8_ =
       *(undefined8 *)((gtxid->m_hash).super_base_blob<256U>.m_data._M_elems + 0x10);
  local_58.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_ =
       *(undefined8 *)((gtxid->m_hash).super_base_blob<256U>.m_data._M_elems + 0x18);
  bVar2 = TxOrphanage::HaveTx(&this->m_orphanage,&local_58);
  bVar3 = true;
  if (!bVar2) {
    if (include_reconsiderable) {
      pCVar4 = RecentRejectsReconsiderableFilter(this);
      vKey.m_size = 0x20;
      vKey.m_data = (uchar *)puVar1;
      bVar2 = CRollingBloomFilter::contains(pCVar4,vKey);
      bVar3 = true;
      if (bVar2) goto LAB_001dfdbc;
    }
    pCVar4 = RecentConfirmedTransactionsFilter(this);
    vKey_00.m_size = 0x20;
    vKey_00.m_data = (uchar *)puVar1;
    bVar2 = CRollingBloomFilter::contains(pCVar4,vKey_00);
    bVar3 = true;
    if (!bVar2) {
      pCVar4 = RecentRejectsFilter(this);
      vKey_01.m_size = 0x20;
      vKey_01.m_data = (uchar *)puVar1;
      bVar2 = CRollingBloomFilter::contains(pCVar4,vKey_01);
      if (!bVar2) {
        bVar3 = CTxMemPool::exists(this->m_mempool,gtxid);
      }
    }
  }
LAB_001dfdbc:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool PeerManagerImpl::AlreadyHaveTx(const GenTxid& gtxid, bool include_reconsiderable)
{
    AssertLockHeld(m_tx_download_mutex);

    const uint256& hash = gtxid.GetHash();

    if (gtxid.IsWtxid()) {
        // Normal query by wtxid.
        if (m_orphanage.HaveTx(Wtxid::FromUint256(hash))) return true;
    } else {
        // Never query by txid: it is possible that the transaction in the orphanage has the same
        // txid but a different witness, which would give us a false positive result. If we decided
        // not to request the transaction based on this result, an attacker could prevent us from
        // downloading a transaction by intentionally creating a malleated version of it.  While
        // only one (or none!) of these transactions can ultimately be confirmed, we have no way of
        // discerning which one that is, so the orphanage can store multiple transactions with the
        // same txid.
        //
        // While we won't query by txid, we can try to "guess" what the wtxid is based on the txid.
        // A non-segwit transaction's txid == wtxid. Query this txid "casted" to a wtxid. This will
        // help us find non-segwit transactions, saving bandwidth, and should have no false positives.
        if (m_orphanage.HaveTx(Wtxid::FromUint256(hash))) return true;
    }

    if (include_reconsiderable && RecentRejectsReconsiderableFilter().contains(hash)) return true;

    if (RecentConfirmedTransactionsFilter().contains(hash)) return true;

    return RecentRejectsFilter().contains(hash) || m_mempool.exists(gtxid);
}